

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O2

void model_rd_with_curvfit
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE plane_bsize,int plane,int64_t sse,
               int num_samples,int *rate,int64_t *dist)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  undefined7 in_register_00000011;
  undefined4 in_register_0000008c;
  long lVar6;
  double dVar7;
  double dVar8;
  double sse_norm;
  double dist_by_sse_norm_f;
  double rate_f;
  
  lVar5 = CONCAT44(in_register_0000000c,plane);
  piVar1 = (int *)CONCAT44(in_register_0000008c,num_samples);
  if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8) == 0)
  {
    bVar4 = 3;
  }
  else {
    bVar4 = (char)*(undefined4 *)(cpi->enc_quant_dequant_params).quants.y_zbin[0xb3] - 5;
  }
  if (lVar5 == 0) {
    if (piVar1 != (int *)0x0) {
      *piVar1 = 0;
    }
    if (rate != (int *)0x0) {
      rate[0] = 0;
      rate[1] = 0;
    }
  }
  else {
    iVar2 = (int)*(short *)(*(long *)((long)(cpi->enc_quant_dequant_params).quants.y_quant +
                                     (long)(int)CONCAT71(in_register_00000011,plane_bsize) * 0x88 +
                                     0x70) + 2) >> (bVar4 & 0x1f);
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    dVar7 = (double)(int)sse;
    sse_norm = (double)lVar5 / dVar7;
    dVar8 = log2(sse_norm / ((double)iVar3 * (double)iVar3));
    av1_model_rd_curvfit((BLOCK_SIZE)x,sse_norm,dVar8,&rate_f,&dist_by_sse_norm_f);
    dVar8 = 0.0;
    if (0.0 <= rate_f * dVar7) {
      dVar8 = rate_f * dVar7;
    }
    iVar3 = (int)(dVar8 + 0.5);
    if (iVar3 == 0) {
      lVar6 = lVar5 << 4;
      iVar2 = 0;
    }
    else {
      dVar7 = sse_norm * dist_by_sse_norm_f * dVar7;
      dVar8 = 0.0;
      if (0.0 <= dVar7) {
        dVar8 = dVar7;
      }
      lVar6 = lVar5 << 4;
      iVar2 = 0;
      if ((long)(dVar8 + 0.5) * 0x80 +
          ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) * (long)iVar3
           + 0x100 >> 9) < lVar5 * 0x800) {
        lVar6 = (long)(dVar8 + 0.5);
        iVar2 = iVar3;
      }
    }
    if (piVar1 != (int *)0x0) {
      *piVar1 = iVar2;
    }
    if (rate != (int *)0x0) {
      *(long *)rate = lVar6;
    }
  }
  return;
}

Assistant:

static inline void model_rd_with_curvfit(const AV1_COMP *const cpi,
                                         const MACROBLOCK *const x,
                                         BLOCK_SIZE plane_bsize, int plane,
                                         int64_t sse, int num_samples,
                                         int *rate, int64_t *dist) {
  (void)cpi;
  (void)plane_bsize;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = AOMMAX(p->dequant_QTX[1] >> dequant_shift, 1);

  if (sse == 0) {
    if (rate) *rate = 0;
    if (dist) *dist = 0;
    return;
  }
  const double sse_norm = (double)sse / num_samples;
  const double qstepsqr = (double)qstep * qstep;
  const double xqr = log2(sse_norm / qstepsqr);
  double rate_f, dist_by_sse_norm_f;
  av1_model_rd_curvfit(plane_bsize, sse_norm, xqr, &rate_f,
                       &dist_by_sse_norm_f);

  const double dist_f = dist_by_sse_norm_f * sse_norm;
  int rate_i = (int)(AOMMAX(0.0, rate_f * num_samples) + 0.5);
  int64_t dist_i = (int64_t)(AOMMAX(0.0, dist_f * num_samples) + 0.5);

  // Check if skip is better
  if (rate_i == 0) {
    dist_i = sse << 4;
  } else if (RDCOST(x->rdmult, rate_i, dist_i) >=
             RDCOST(x->rdmult, 0, sse << 4)) {
    rate_i = 0;
    dist_i = sse << 4;
  }

  if (rate) *rate = rate_i;
  if (dist) *dist = dist_i;
}